

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O3

uint ApplicativeHelper::getArity(TermList sort)

{
  bool bVar1;
  uint uVar2;
  uint64_t in_RDI;
  TermList local_20;
  
  local_20._content = in_RDI;
  bVar1 = Kernel::TermList::isArrowSort(&local_20);
  uVar2 = 0;
  if (bVar1) {
    uVar2 = 0;
    do {
      local_20._content =
           *(uint64_t *)
            (local_20._content + 0x20 + (ulong)(*(uint *)(local_20._content + 0xc) & 0xfffffff) * 8)
      ;
      uVar2 = uVar2 + 1;
      bVar1 = Kernel::TermList::isArrowSort(&local_20);
    } while (bVar1);
  }
  return uVar2;
}

Assistant:

unsigned ApplicativeHelper::getArity(TermList sort)
{
  unsigned arity = 0;
  while(sort.isArrowSort()){
    sort = *sort.term()->nthArgument(1);
    arity++; 
  }
  return arity;
}